

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall
Parameter<std::pair<int,_int>_>::internalSetData<unsigned_long>
          (Parameter<std::pair<int,_int>_> *this,unsigned_long data)

{
  bool bVar1;
  unsigned_long in_RSI;
  long in_RDI;
  bool result;
  pair<int,_int> tmp;
  pair<int,_int> local_18;
  unsigned_long local_10;
  
  local_10 = in_RSI;
  std::pair<int,_int>::pair<int,_int,_true>(&local_18);
  bVar1 = ParameterTraits<std::pair<int,_int>_>::convert<unsigned_long>(local_10,&local_18);
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x2a) = 0;
    std::pair<int,_int>::operator=((pair<int,_int> *)(in_RDI + 0x2c),&local_18);
  }
  return bVar1;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }